

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O0

void dlib::blas_bindings::
     matrix_assign_blas<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout,dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
                      *src)

{
  bool bVar1;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *dest_00;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
  *in_stack_ffffffffffffffa8;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_ffffffffffffffb0;
  matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  *in_stack_ffffffffffffffb8;
  matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
  *in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
          ::
          aliases<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    dest_00 = (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 ::nr((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                       *)0x28a930);
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::nc
              ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)0x28a93f);
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    matrix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(long)in_stack_ffffffffffffffc0);
    matrix_assign_blas_proxy<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
              (dest_00,in_stack_ffffffffffffffa8,0.0,false,true);
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    swap(dest_00,(matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  *)in_stack_ffffffffffffffa8);
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    ~matrix((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
             *)0x28a98e);
  }
  else {
    matrix_assign_blas_proxy<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0.0,false,true);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            matrix<T,NR,NC,MM,L>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(dest))
            {
                matrix<T,NR,NC,MM,L> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                temp.swap(dest);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }